

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

int __thiscall r_code::list<r_code::Code_*>::remove(list<r_code::Code_*> *this,char *__filename)

{
  pointer pcVar1;
  const_iterator cVar2;
  const_iterator local_10;
  
  local_10.super__iterator._cell = this->used_cells_head;
  pcVar1 = (this->cells).
           super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (local_10.super__iterator._cell == list<r_code::Code*>::end_iterator) {
LAB_0017d418:
      return (int)local_10.super__iterator._cell;
    }
    if (pcVar1[local_10.super__iterator._cell].data == *(Code **)__filename) {
      local_10._list = this;
      cVar2 = erase(this,&local_10);
      local_10.super__iterator = cVar2.super__iterator._cell;
      goto LAB_0017d418;
    }
    local_10.super__iterator._cell = pcVar1[local_10.super__iterator._cell].next;
  } while( true );
}

Assistant:

void remove(const T &t)
    {
        const_iterator i(this, used_cells_head);

        for (; i != end_iterator; ++i) {
            if ((*i) == t) {
                erase(i);
                return;
            }
        }
    }